

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O1

bool __thiscall
duckdb::CatalogSet::AlterOwnership
          (CatalogSet *this,CatalogTransaction transaction,ChangeOwnershipInfo *info)

{
  string *name;
  CatalogType type;
  DuckCatalog *pDVar1;
  pointer pcVar2;
  DatabaseInstance *pDVar3;
  CatalogTransaction transaction_00;
  optional_ptr<duckdb::CatalogEntry,_true> owner;
  undefined8 uVar4;
  int iVar5;
  optional_ptr<duckdb::CatalogEntry,_true> oVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CatalogException *this_00;
  DatabaseInstance *pDVar7;
  initializer_list<duckdb::CatalogType> __l;
  optional_ptr<duckdb::CatalogEntry,_true> owner_entry;
  vector<duckdb::CatalogType,_true> entry_types;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> schema;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  unique_lock<std::mutex> write_lock;
  EntryLookupInfo schema_lookup;
  allocator_type local_121;
  optional_ptr<duckdb::CatalogEntry,_true> local_120;
  undefined1 local_118 [32];
  transaction_t local_f8;
  ChangeOwnershipInfo *local_f0;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> local_e8;
  optional_ptr<duckdb::CatalogEntry,_true> local_e0;
  CatalogSet *local_d8;
  CatalogEntry *local_d0;
  unique_lock<std::mutex> local_c8;
  DatabaseInstance *local_b8;
  ClientContext *pCStack_b0;
  Transaction *local_a8;
  transaction_t tStack_a0;
  transaction_t local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  EntryLookupInfo local_50;
  
  local_c8._M_device = &this->catalog->write_lock;
  local_c8._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_c8);
  local_c8._M_owns = true;
  oVar6 = GetEntryInternal(this,transaction,&(info->super_AlterInfo).name);
  local_e0 = oVar6;
  if (oVar6.ptr != (CatalogEntry *)0x0) {
    local_120.ptr = (CatalogEntry *)0x0;
    pDVar1 = this->catalog;
    local_f8 = transaction.start_time;
    local_118._16_8_ = transaction.transaction.ptr;
    local_118._24_8_ = transaction.transaction_id;
    local_118._0_8_ = transaction.db.ptr;
    local_118._8_8_ = transaction.context.ptr;
    EntryLookupInfo::EntryLookupInfo
              (&local_50,SCHEMA_ENTRY,&info->owner_schema,(QueryErrorContext)0xffffffffffffffff);
    iVar5 = (*(pDVar1->super_Catalog)._vptr_Catalog[8])(pDVar1,&local_50,1);
    local_e8.ptr = (SchemaCatalogEntry *)CONCAT44(extraout_var,iVar5);
    if (local_e8.ptr != (SchemaCatalogEntry *)0x0) {
      local_50.catalog_type = TABLE_ENTRY;
      local_50._1_1_ = 6;
      __l._M_len = 2;
      __l._M_array = &local_50.catalog_type;
      local_f0 = info;
      local_d8 = this;
      local_d0 = oVar6.ptr;
      ::std::vector<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>::vector
                ((vector<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_> *)local_118,__l,
                 &local_121);
      uVar4 = local_118._8_8_;
      if (local_118._0_8_ != local_118._8_8_) {
        name = &local_f0->owner_name;
        pDVar3 = (DatabaseInstance *)local_118._0_8_;
        oVar6.ptr = local_120.ptr;
        do {
          local_120.ptr = oVar6.ptr;
          pDVar7 = (DatabaseInstance *)
                   ((long)&(pDVar3->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                           __weak_this_.internal.
                           super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 1);
          type = *(CatalogType *)
                  &(pDVar3->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.
                   internal.super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(&local_e8);
          local_120 = SchemaCatalogEntry::GetEntry(local_e8.ptr,transaction,type,name);
          if (local_120.ptr != (CatalogEntry *)0x0) break;
          pDVar3 = pDVar7;
          oVar6.ptr = (CatalogEntry *)0x0;
        } while (pDVar7 != (DatabaseInstance *)uVar4);
      }
      oVar6.ptr = local_d0;
      info = local_f0;
      this = local_d8;
      if ((DatabaseInstance *)local_118._0_8_ != (DatabaseInstance *)0x0) {
        operator_delete((void *)local_118._0_8_);
        info = local_f0;
        this = local_d8;
      }
    }
    if (local_120.ptr == (CatalogEntry *)0x0) {
      this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_118._0_8_ = local_118 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"CatalogElement \"%s.%s\" does not exist!","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar2 = (info->owner_schema)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + (info->owner_schema)._M_string_length);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar2 = (info->owner_name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + (info->owner_name)._M_string_length);
      CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
                (this_00,(string *)local_118,&local_70,&local_90);
      __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::unique_lock<std::mutex>::unlock(&local_c8);
    iVar5 = (*(this->catalog->super_Catalog)._vptr_Catalog[0x1a])();
    local_118._0_8_ = CONCAT44(extraout_var_00,iVar5);
    optional_ptr<duckdb::DependencyManager,_true>::CheckValid
              ((optional_ptr<duckdb::DependencyManager,_true> *)local_118);
    uVar4 = local_118._0_8_;
    local_b8 = transaction.db.ptr;
    pCStack_b0 = transaction.context.ptr;
    local_a8 = transaction.transaction.ptr;
    tStack_a0 = transaction.transaction_id;
    local_98 = transaction.start_time;
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_120);
    owner.ptr = local_120.ptr;
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_e0);
    transaction_00.context.ptr._0_4_ = (int)pCStack_b0;
    transaction_00.db.ptr = local_b8;
    transaction_00.context.ptr._4_4_ = (int)((ulong)pCStack_b0 >> 0x20);
    transaction_00.transaction.ptr._0_4_ = (int)local_a8;
    transaction_00.transaction.ptr._4_4_ = (int)((ulong)local_a8 >> 0x20);
    transaction_00.transaction_id._0_4_ = (int)tStack_a0;
    transaction_00.transaction_id._4_4_ = (int)(tStack_a0 >> 0x20);
    transaction_00.start_time = local_98;
    DependencyManager::AddOwnership
              ((DependencyManager *)uVar4,transaction_00,owner.ptr,local_e0.ptr);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_c8);
  return oVar6.ptr != (CatalogEntry *)0x0;
}

Assistant:

bool CatalogSet::AlterOwnership(CatalogTransaction transaction, ChangeOwnershipInfo &info) {
	// lock the catalog for writing
	unique_lock<mutex> write_lock(catalog.GetWriteLock());

	auto entry = GetEntryInternal(transaction, info.name);
	if (!entry) {
		return false;
	}
	optional_ptr<CatalogEntry> owner_entry;
	auto schema = catalog.GetSchema(transaction, info.owner_schema, OnEntryNotFound::RETURN_NULL);
	if (schema) {
		vector<CatalogType> entry_types {CatalogType::TABLE_ENTRY, CatalogType::SEQUENCE_ENTRY};
		for (auto entry_type : entry_types) {
			owner_entry = schema->GetEntry(transaction, entry_type, info.owner_name);
			if (owner_entry) {
				break;
			}
		}
	}
	if (!owner_entry) {
		throw CatalogException("CatalogElement \"%s.%s\" does not exist!", info.owner_schema, info.owner_name);
	}
	write_lock.unlock();
	catalog.GetDependencyManager()->AddOwnership(transaction, *owner_entry, *entry);
	return true;
}